

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O2

Chars * sentencepiece::normalizer::anon_unknown_1::Normalize
                  (Chars *__return_storage_ptr__,CharsMap *chars_map,Chars *src,int max_len)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  char *pcVar3;
  ostream *poVar4;
  const_iterator cVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  allocator_type local_59;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_58;
  Chars key;
  
  local_58.container = __return_storage_ptr__;
  if (max_len < 1) {
    key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 1;
    pcVar3 = logging::BaseName("third_party/sentencepiece/src/builder.cc");
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7a);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"(max_len) >= (1)");
    std::operator<<(poVar4,"] ");
    error::Die::~Die((Die *)&key);
  }
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(chars_map->_M_t)._M_impl.super__Rb_tree_header;
  uVar8 = 0;
  do {
    puVar2 = (src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    if (uVar6 <= uVar8) {
      return local_58.container;
    }
    uVar7 = (long)max_len + uVar8;
    if (uVar6 < (long)max_len + uVar8) {
      uVar7 = uVar6;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&key,
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(puVar2 + uVar8),
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(puVar2 + uVar7),&local_59);
    cVar5._M_node = &p_Var1->_M_header;
    for (; (pointer)CONCAT71(key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_) !=
           key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
        key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1) {
      cVar5 = std::
              _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::find(&chars_map->_M_t,(key_type *)&key);
      if ((_Rb_tree_header *)cVar5._M_node != p_Var1) break;
    }
    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (local_58.container,
                 (src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar8);
      uVar8 = uVar8 + 1;
    }
    else {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (&(cVar5._M_node[1]._M_right)->_M_color,*(uint **)(cVar5._M_node + 2),local_58);
      uVar8 = uVar8 + ((long)cVar5._M_node[1]._M_parent - *(long *)(cVar5._M_node + 1) >> 2);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&key);
  } while( true );
}

Assistant:

Builder::Chars Normalize(const Builder::CharsMap &chars_map,
                         const Builder::Chars &src, int max_len) {
  CHECK_GE(max_len, 1);
  Builder::Chars normalized;

  for (size_t i = 0; i < src.size();) {
    Builder::CharsMap::const_iterator it = chars_map.end();
    const size_t slice = std::min<size_t>(i + max_len, src.size());
    // starts with the longest prefix.
    Builder::Chars key(src.begin() + i, src.begin() + slice);
    while (!key.empty()) {
      it = chars_map.find(key);
      if (it != chars_map.end()) {
        break;
      }
      key.pop_back();  // remove the last character.
    }

    // Consumes one character when no rule is found.
    if (it == chars_map.end()) {
      normalized.push_back(src[i]);
      ++i;
    } else {
      std::copy(it->second.begin(), it->second.end(),
                std::back_inserter(normalized));
      i += it->first.size();
    }
  }

  return normalized;
}